

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.cpp
# Opt level: O1

void __thiscall
Diligent::RenderPassCache::RenderPassCache(RenderPassCache *this,RenderDeviceVkImpl *DeviceVk)

{
  this->m_DeviceVkImpl = DeviceVk;
  (this->m_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->m_Cache)._M_h._M_buckets = &(this->m_Cache)._M_h._M_single_bucket;
  (this->m_Cache)._M_h._M_bucket_count = 1;
  (this->m_Cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_Cache)._M_h._M_element_count = 0;
  (this->m_Cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_Cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_Cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

RenderPassCache::RenderPassCache(RenderDeviceVkImpl& DeviceVk) noexcept :
    m_DeviceVkImpl{DeviceVk}
{}